

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-legacy.cc
# Opt level: O3

bool __thiscall DataSourceLegacy::load_animation_table(DataSourceLegacy *this,PBuffer *data)

{
  uint8_t uVar1;
  undefined2 uVar2;
  uint uVar3;
  uint uVar4;
  element_type *peVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  size_t i;
  long lVar9;
  ulong uVar10;
  int j;
  long lVar11;
  undefined2 *puVar12;
  undefined1 uVar14;
  undefined1 auVar13 [16];
  vector<Data::Animation,_std::allocator<Data::Animation>_> animations;
  size_t sizes [200];
  value_type local_6b8;
  Animation local_694;
  vector<std::vector<Data::Animation,_std::allocator<Data::Animation>_>,_std::allocator<std::vector<Data::Animation,_std::allocator<Data::Animation>_>_>_>
  *local_688;
  long local_680;
  ulong auStack_678 [201];
  
  peVar5 = (data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peVar5->endianess = EndianessBig;
  pvVar6 = peVar5->data;
  lVar9 = 0;
  do {
    uVar3 = *(uint *)((long)pvVar6 + lVar9 * 4);
    *(uint *)((long)pvVar6 + lVar9 * 4) =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 200);
  uVar10 = peVar5->size;
  lVar9 = 0;
  do {
    uVar3 = *(uint *)((long)pvVar6 + lVar9 * 4);
    lVar11 = 0;
    uVar7 = uVar10;
    do {
      uVar4 = *(uint *)((long)pvVar6 + lVar11 * 4);
      uVar8 = (ulong)uVar4;
      if (uVar7 < uVar4) {
        uVar8 = uVar7;
      }
      if (uVar4 <= uVar3) {
        uVar8 = uVar7;
      }
      lVar11 = lVar11 + 1;
      uVar7 = uVar8;
    } while (lVar11 != 200);
    auStack_678[lVar9] = (uVar8 - uVar3) / 3;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 200);
  local_688 = &(this->super_DataSourceBase).animation_table;
  local_680 = (long)pvVar6 + 1;
  lVar9 = 0;
  do {
    local_6b8.super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_6b8.super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_6b8.super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (Animation *)0x0;
    uVar10 = auStack_678[lVar9];
    if (uVar10 != 0) {
      puVar12 = (undefined2 *)(*(int *)((long)pvVar6 + lVar9 * 4) + local_680);
      do {
        uVar1 = *(uint8_t *)((long)puVar12 + -1);
        local_694.sprite = uVar1;
        uVar2 = *puVar12;
        uVar14 = (undefined1)((ushort)uVar2 >> 8);
        auVar13 = ZEXT416(CONCAT22((short)(CONCAT13(uVar14,CONCAT12(uVar14,uVar2)) >> 0x10),
                                   CONCAT11((char)uVar2,(char)uVar2)));
        auVar13 = pshuflw(auVar13,auVar13,0x60);
        local_694.x = auVar13._0_4_ >> 0x18;
        local_694.y = auVar13._4_4_ >> 0x18;
        if (local_6b8.super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_6b8.super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Data::Animation,std::allocator<Data::Animation>>::
          _M_realloc_insert<Data::Animation_const&>
                    ((vector<Data::Animation,std::allocator<Data::Animation>> *)&local_6b8,
                     (iterator)
                     local_6b8.super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_694);
        }
        else {
          (local_6b8.super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>._M_impl.
           super__Vector_impl_data._M_finish)->y = local_694.y;
          (local_6b8.super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>._M_impl.
           super__Vector_impl_data._M_finish)->sprite = uVar1;
          *(undefined3 *)
           &(local_6b8.super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>._M_impl
             .super__Vector_impl_data._M_finish)->field_0x1 = local_694._1_3_;
          (local_6b8.super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>._M_impl.
           super__Vector_impl_data._M_finish)->x = local_694.x;
          local_6b8.super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_6b8.super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        puVar12 = (undefined2 *)((long)puVar12 + 3);
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
    std::
    vector<std::vector<Data::Animation,_std::allocator<Data::Animation>_>,_std::allocator<std::vector<Data::Animation,_std::allocator<Data::Animation>_>_>_>
    ::push_back(local_688,&local_6b8);
    if (local_6b8.super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_6b8.
                      super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_6b8.
                            super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_6b8.
                            super__Vector_base<Data::Animation,_std::allocator<Data::Animation>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 200);
  return true;
}

Assistant:

bool
DataSourceLegacy::load_animation_table(PBuffer data) {
  // The serf animation table is stored in big endian order in the data file.
  data->set_endianess(Buffer::EndianessBig);

  // * Starts with 200 uint32s that are offsets from the start
  // of this table to an animation table (one for each animation).
  // * The animation tables are of varying lengths.
  // Each entry in the animation table is three bytes long.
  // First byte is used to determine the serf body sprite.
  // Second byte is a signed horizontal sprite offset.
  // Third byte is a signed vertical offset.

  if (data == nullptr) {
    return false;
  }
  uint32_t *animation_block = reinterpret_cast<uint32_t*>(data->get_data());

  // Endianess convert from big endian.
  for (size_t i = 0; i < 200; i++) {
    animation_block[i] = betoh(animation_block[i]);
  }

  size_t sizes[200];

  for (size_t i = 0; i < 200; i++) {
    size_t a = animation_block[i];
    size_t next = data->get_size();
    for (int j = 0; j < 200; j++) {
      size_t b = animation_block[j];
      if (b > a) {
        next = std::min(next, b);
      }
    }
    sizes[i] = (next - a)/3;
  }

  for (size_t i = 0; i < 200; i++) {
    int offset = animation_block[i];
    AnimationPhase *anims =
    reinterpret_cast<AnimationPhase*>(reinterpret_cast<char*>(animation_block) +
                                      offset);
    std::vector<Data::Animation> animations;
    for (size_t j = 0; j < sizes[i]; j++) {
      Data::Animation a;
      a.sprite = anims[j].sprite;
      a.x = anims[j].x;
      a.y = anims[j].y;
      animations.push_back(a);
    }
    animation_table.push_back(animations);
  }

  return true;
}